

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void __thiscall Fl_RGB_Image::color_average(Fl_RGB_Image *this,Fl_Color c,float i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  int local_6c;
  int local_50;
  int line_i;
  int y;
  int x;
  uchar *old_ptr;
  uint ib;
  uint ig;
  uint ir;
  uint ia;
  uchar b;
  uchar g;
  uchar r;
  uchar *new_ptr;
  uchar *new_array;
  float i_local;
  Fl_Color c_local;
  Fl_RGB_Image *this_local;
  
  new_array._0_4_ = i;
  new_array._4_4_ = c;
  _i_local = this;
  iVar1 = Fl_Image::w(&this->super_Fl_Image);
  if ((((iVar1 != 0) && (iVar1 = Fl_Image::h(&this->super_Fl_Image), iVar1 != 0)) &&
      (iVar1 = Fl_Image::d(&this->super_Fl_Image), iVar1 != 0)) && (this->array != (uchar *)0x0)) {
    (*(this->super_Fl_Image)._vptr_Fl_Image[8])();
    if (this->alloc_array == 0) {
      iVar1 = Fl_Image::h(&this->super_Fl_Image);
      iVar2 = Fl_Image::w(&this->super_Fl_Image);
      iVar3 = Fl_Image::d(&this->super_Fl_Image);
      new_ptr = (uchar *)operator_new__((long)(iVar1 * iVar2 * iVar3));
    }
    else {
      new_ptr = this->array;
    }
    Fl::get_color(new_array._4_4_,(uchar *)((long)&ir + 3),(uchar *)((long)&ir + 2),
                  (uchar *)((long)&ir + 1));
    if (0.0 <= new_array._0_4_) {
      if (1.0 < new_array._0_4_) {
        new_array._0_4_ = 1.0;
      }
    }
    else {
      new_array._0_4_ = 0.0;
    }
    iVar1 = (int)(long)(new_array._0_4_ * 256.0);
    uVar4 = (uint)ir._3_1_;
    uVar5 = (uint)ir._2_1_;
    uVar6 = (uint)ir._1_1_;
    iVar2 = Fl_Image::ld(&this->super_Fl_Image);
    if (iVar2 == 0) {
      local_6c = 0;
    }
    else {
      local_6c = Fl_Image::ld(&this->super_Fl_Image);
      iVar2 = Fl_Image::w(&this->super_Fl_Image);
      iVar3 = Fl_Image::d(&this->super_Fl_Image);
      local_6c = local_6c - iVar2 * iVar3;
    }
    iVar2 = Fl_Image::d(&this->super_Fl_Image);
    if (iVar2 < 3) {
      _ia = new_ptr;
      _y = this->array;
      for (local_50 = 0; iVar2 = Fl_Image::h(&this->super_Fl_Image), local_50 < iVar2;
          local_50 = local_50 + 1) {
        for (line_i = 0; iVar2 = Fl_Image::w(&this->super_Fl_Image), line_i < iVar2;
            line_i = line_i + 1) {
          *_ia = (byte)((uint)*_y * iVar1 +
                        (((uint)ir._3_1_ * 0x1f + (uint)ir._2_1_ * 0x3d + (uint)ir._1_1_ * 8) / 100)
                        * (0x100 - iVar1) >> 8);
          _ia = _ia + 1;
          iVar2 = Fl_Image::d(&this->super_Fl_Image);
          pbVar7 = _y + 1;
          if (1 < iVar2) {
            *_ia = _y[1];
            pbVar7 = _y + 2;
            _ia = _ia + 1;
          }
          _y = pbVar7;
        }
        _y = _y + local_6c;
      }
    }
    else {
      _ia = new_ptr;
      _y = this->array;
      for (local_50 = 0; iVar2 = Fl_Image::h(&this->super_Fl_Image), local_50 < iVar2;
          local_50 = local_50 + 1) {
        for (line_i = 0; iVar2 = Fl_Image::w(&this->super_Fl_Image), line_i < iVar2;
            line_i = line_i + 1) {
          *_ia = (byte)((uint)*_y * iVar1 + uVar4 * (0x100 - iVar1) >> 8);
          pbVar7 = _ia + 2;
          _ia[1] = (byte)((uint)_y[1] * iVar1 + uVar5 * (0x100 - iVar1) >> 8);
          _ia = _ia + 3;
          *pbVar7 = (byte)((uint)_y[2] * iVar1 + uVar6 * (0x100 - iVar1) >> 8);
          iVar2 = Fl_Image::d(&this->super_Fl_Image);
          pbVar7 = _y + 3;
          if (3 < iVar2) {
            *_ia = _y[3];
            pbVar7 = _y + 4;
            _ia = _ia + 1;
          }
          _y = pbVar7;
        }
        _y = _y + local_6c;
      }
    }
    if (this->alloc_array == 0) {
      this->array = new_ptr;
      this->alloc_array = 1;
      Fl_Image::ld(&this->super_Fl_Image,0);
    }
  }
  return;
}

Assistant:

void Fl_RGB_Image::color_average(Fl_Color c, float i) {
  // Don't average an empty image...
  if (!w() || !h() || !d() || !array) return;

  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  uchar		*new_array,
		*new_ptr;

  if (!alloc_array) new_array = new uchar[h() * w() * d()];
  else new_array = (uchar *)array;

  // Get the color to blend with...
  uchar		r, g, b;
  unsigned	ia, ir, ig, ib;

  Fl::get_color(c, r, g, b);
  if (i < 0.0f) i = 0.0f;
  else if (i > 1.0f) i = 1.0f;

  ia = (unsigned)(256 * i);
  ir = r * (256 - ia);
  ig = g * (256 - ia);
  ib = b * (256 - ia);

  // Update the image data to do the blend...
  const uchar	*old_ptr;
  int		x, y;
  int   line_i = ld() ? ld() - (w()*d()) : 0; // increment from line end to beginning of next line

  if (d() < 3) {
    ig = (r * 31 + g * 61 + b * 8) / 100 * (256 - ia);

    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	if (d() > 1) *new_ptr++ = *old_ptr++;
      }
  } else {
    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ir) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ib) >> 8;
	if (d() > 3) *new_ptr++ = *old_ptr++;
      }
  }

  // Set the new pointers/values as needed...
  if (!alloc_array) {
    array       = new_array;
    alloc_array = 1;

    ld(0);
  }
}